

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetConfigurable
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  Type TVar1;
  ObjectSlotAttributes *instanceAttributes;
  bool bVar2;
  PropertyIndex propertyIndex;
  BOOL BVar3;
  int iVar4;
  PropertyRecord *pPVar5;
  undefined4 extraout_var;
  
  propertyIndex =
       TypePath::LookupInline
                 ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                  propertyId,
                  (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                         super_DynamicTypeHandler.unusedBytes >> 1));
  if (propertyIndex == 0xffff) {
    if ((value == 0) && (bVar2 = DynamicObject::HasObjectArray(instance), bVar2)) {
      pPVar5 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
      TVar1 = pPVar5->isNumeric;
      if (TVar1 == true) {
        iVar4 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x48])(this,instance);
        pPVar5 = (PropertyRecord *)
                 (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x158))
                           ((long *)CONCAT44(extraout_var,iVar4),instance,propertyId,0);
      }
      if (TVar1 != false) {
        return (BOOL)pPVar5;
      }
    }
    BVar3 = 1;
  }
  else {
    instanceAttributes = (this->attributes).ptr;
    BVar3 = PathTypeHandlerBase::SetAttributesHelper
                      ((PathTypeHandlerBase *)this,instance,propertyId,propertyIndex,
                       instanceAttributes,
                       (value != 0) * '\x02' |
                       instanceAttributes[propertyIndex] & ~ObjectSlotAttr_Configurable,false);
  }
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            if (!value)
            {
                // Upgrade type handler if set objectArray item attribute.
                // Only check numeric propertyId if objectArray available.
                if (instance->HasObjectArray())
                {
                    PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                    if (propertyRecord->IsNumeric())
                    {
                        return ConvertToTypeWithItemAttributes(instance)->SetConfigurable(instance, propertyId, value);
                    }
                }
            }
            return true;
        }

        ObjectSlotAttributes attr =
            (ObjectSlotAttributes)(value ? (attributes[propertyIndex] | ObjectSlotAttr_Configurable) : (attributes[propertyIndex] & ~ObjectSlotAttr_Configurable));
        return SetAttributesHelper(instance, propertyId, propertyIndex, attributes, attr);
    }